

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf-decoder.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  long *data;
  int iVar1;
  int iVar2;
  size_t sVar3;
  runtime_error *this;
  string buffer;
  string filename;
  ulong local_2a8;
  long *local_2a0;
  ulong local_298;
  long local_290 [2];
  ulong local_280;
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  string local_238 [16];
  
  local_280 = 0;
  local_2a8 = 0xffffffffffffffff;
  iVar2 = 0;
  do {
    iVar1 = getopt_long(argc,argv,"hl:o:",main::long_options,0);
    if (iVar1 < 0x6c) {
      if (iVar1 == -1) {
        iVar1 = 3;
      }
      else if (iVar1 == 0x68) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Usage: pbf-decoder [OPTIONS] [INPUT_FILE]\n\n",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Dump raw contents of protobuf encoded file.\n",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"To read from STDIN use \'-\' as INPUT_FILE.\n",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nOptions:\n",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  -h, --help           This help message\n",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  -l, --length=LENGTH  Read only LENGTH bytes\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  -o, --offset=OFFSET  Start reading from OFFSET bytes\n",
                   0x37);
        iVar2 = 0;
        iVar1 = 1;
      }
      else {
LAB_001024ef:
        iVar1 = 1;
        iVar2 = 1;
      }
    }
    else {
      if (iVar1 == 0x6c) {
        local_2a8 = atoll(_optarg);
      }
      else {
        if (iVar1 != 0x6f) goto LAB_001024ef;
        local_280 = atoll(_optarg);
      }
      iVar1 = 0;
    }
    if (iVar1 != 0) {
      if (iVar1 == 3) {
        if (argc - _optind == 1) {
          std::__cxx11::string::string((string *)local_258,argv[_optind],(allocator *)local_238);
          iVar2 = std::__cxx11::string::compare((char *)local_258);
          if (iVar2 == 0) {
            local_2a0 = local_290;
            std::__cxx11::string::
            _M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                      ((string *)&local_2a0,*(undefined8 *)(*(long *)(std::cin + -0x18) + 0x108258),
                       0xffffffff,0,0xffffffff);
          }
          else {
            std::ifstream::ifstream(local_238,argv[_optind],_S_bin);
            local_2a0 = local_290;
            std::__cxx11::string::
            _M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                      ((string *)&local_2a0,&local_238[0].field_2,0xffffffff,0,0xffffffff);
            std::ifstream::~ifstream(local_238);
          }
          if (local_298 < local_280) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"offset is larger than file size");
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (local_280 != 0) {
            std::__cxx11::string::erase((ulong)&local_2a0,0);
          }
          if (local_2a8 < local_298) {
            std::__cxx11::string::resize((ulong)&local_2a0,(char)local_2a8);
          }
          data = local_2a0;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
          anon_unknown.dwarf_6616::decode(local_238,(char *)data,local_298,&local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                     local_238[0]._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
            operator_delete(local_238[0]._M_dataplus._M_p,
                            local_238[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_2a0 != local_290) {
            operator_delete(local_2a0,local_290[0] + 1);
          }
          iVar2 = 0;
          if (local_258[0] != local_248) {
            operator_delete(local_258[0],local_248[0] + 1);
            iVar2 = 0;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
          __s = *argv;
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1081a0);
          }
          else {
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," [OPTIONS] [INPUT_FILE]\n\n",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Call with --help/-h to see options.\n",0x24);
          iVar2 = 1;
        }
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
    static struct option long_options[] = {
        {"help",         no_argument, nullptr, 'h'},
        {"length", required_argument, nullptr, 'l'},
        {"offset", required_argument, nullptr, 'o'},
        {nullptr, 0, nullptr, 0}
    };

    std::size_t offset = 0;
    std::size_t length = std::numeric_limits<std::size_t>::max();

    while (true) {
        const int c = getopt_long(argc, argv, "hl:o:", long_options, nullptr); // NOLINT(concurrency-mt-unsafe) no threads here
        if (c == -1) {
            break;
        }

        switch (c) {
            case 'h':
                print_help();
                return 0;
            case 'l':
                length = std::atoll(optarg); // NOLINT(cert-err34-c)
                                             // good enough for a limited-use tool
                break;
            case 'o':
                offset = std::atoll(optarg); // NOLINT(cert-err34-c)
                                             // good enough for a limited-use tool
                break;
            default:
                return 1;
        }
    }

    const int remaining_args = argc - optind;
    if (remaining_args != 1) {
        std::cerr << "Usage: " << argv[0] << " [OPTIONS] [INPUT_FILE]\n\n"
                  << "Call with --help/-h to see options.\n";
        return 1;
    }

    const std::string filename{argv[optind]};

    try {
        std::string buffer{filename == "-" ? read_from_stdin() :
                                             read_from_file(argv[optind])};

        if (offset > buffer.size()) {
            throw std::runtime_error{"offset is larger than file size"};
        }

        if (offset > 0) {
            buffer.erase(0, offset);
        }

        if (length < buffer.size()) {
            buffer.resize(length);
        }

        std::cout << decode(buffer.data(), buffer.size(), "");
    } catch (const std::exception& ex) {
        std::cerr << ex.what() << '\n';
        return 1;
    }

    return 0;
}